

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O3

QString * __thiscall
QTlsBackend::shortNameForId(QString *__return_storage_ptr__,QTlsBackend *this,int cid)

{
  QDebug QVar1;
  QLoggingCategory *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QArrayData *local_80;
  undefined8 *local_78;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  QDebug local_48;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivateLogging::lcSsl();
  if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_50 = pQVar2->name;
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    QMessageLogger::warning();
    QVar1.stream = local_48.stream;
    QVar3.m_data = (storage_type *)0xb;
    QVar3.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    (**(code **)(*(long *)this + 0x90))(&local_80,this);
    if (local_78 == (undefined8 *)0x0) {
      local_78 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_48,(ulong)local_78);
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QVar1.stream = local_48.stream;
    QVar4.m_data = (storage_type *)0x22;
    QVar4.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    if (local_80 != (QArrayData *)0x0) {
      LOCK();
      (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80,2,0x10);
      }
    }
    QDebug::~QDebug(&local_48);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTlsBackend::shortNameForId(int cid) const
{
    Q_UNUSED(cid);
    REPORT_MISSING_SUPPORT("does not support QSslEllipticCurve");
    return {};
}